

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O2

void pipe_list(t_pipe *x,t_symbol *s,int ac,t_atom *av)

{
  int *piVar1;
  t_atomtype tVar2;
  t_gstub *ptVar3;
  int iVar4;
  undefined4 uVar5;
  t_hang_conflict *owner;
  t_gpointer *ptVar6;
  t_symbol *ptVar7;
  word *pwVar8;
  _clock *x_00;
  long lVar9;
  t_gpointer *ptVar10;
  int iVar11;
  bool bVar12;
  t_float tVar13;
  float fVar14;
  
  owner = (t_hang_conflict *)getbytes((long)x->x_n * 8 + 0x20);
  iVar11 = x->x_n;
  ptVar6 = (t_gpointer *)getbytes((long)x->x_nptr * 0x18);
  owner->h_gp = ptVar6;
  if (iVar11 < ac) {
    ac = iVar11;
    if (av[iVar11].a_type == A_FLOAT) {
      x->x_deltime = av[iVar11].a_w.w_float;
    }
    else {
      pd_error(x,"pipe: symbol or pointer in time inlet");
    }
  }
  ptVar6 = x->x_gp;
  if (ac < 1) {
    ac = 0;
  }
  pwVar8 = &(x->x_vec->p_atom).a_w;
  while (bVar12 = ac != 0, ac = ac + -1, bVar12) {
    tVar2 = ((t_atom *)(pwVar8 + -1))->a_type;
    if (tVar2 == A_POINTER) {
      gpointer_unset(ptVar6);
      if (av->a_type == A_POINTER) {
        ptVar10 = (av->a_w).w_gpointer;
        ptVar3 = ptVar10->gp_stub;
        ptVar6->gp_stub = ptVar3;
        iVar4 = ptVar10->gp_valid;
        uVar5 = *(undefined4 *)&ptVar10->field_0xc;
        ptVar6->gp_un = ptVar10->gp_un;
        ptVar6->gp_valid = iVar4;
        *(undefined4 *)&ptVar6->field_0xc = uVar5;
        if (ptVar3 != (t_gstub *)0x0) {
          ptVar3->gs_refcount = ptVar3->gs_refcount + 1;
        }
      }
      else {
        pd_error(x,"pipe: bad pointer");
      }
      ptVar6 = ptVar6 + 1;
    }
    else if (tVar2 == A_SYMBOL) {
      ptVar7 = atom_getsymbol(av);
      pwVar8->w_symbol = ptVar7;
    }
    else if (tVar2 == A_FLOAT) {
      tVar13 = atom_getfloat(av);
      pwVar8->w_float = tVar13;
    }
    av = av + 1;
    pwVar8 = pwVar8 + 3;
  }
  ptVar6 = x->x_gp;
  ptVar10 = owner->h_gp;
  lVar9 = 0;
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  pwVar8 = &(x->x_vec->p_atom).a_w;
  for (; iVar11 != (int)lVar9; lVar9 = lVar9 + 1) {
    if (((t_atom *)(pwVar8 + -1))->a_type == A_POINTER) {
      if (ptVar6->gp_stub != (t_gstub *)0x0) {
        piVar1 = &ptVar6->gp_stub->gs_refcount;
        *piVar1 = *piVar1 + 1;
      }
      owner->h_vec[lVar9].w_symbol = (t_symbol *)ptVar10;
      ptVar10->gp_stub = ptVar6->gp_stub;
      iVar4 = ptVar6->gp_valid;
      uVar5 = *(undefined4 *)&ptVar6->field_0xc;
      ptVar10->gp_un = ptVar6->gp_un;
      ptVar10->gp_valid = iVar4;
      *(undefined4 *)&ptVar10->field_0xc = uVar5;
      ptVar10 = ptVar10 + 1;
      ptVar6 = ptVar6 + 1;
    }
    else {
      owner->h_vec[lVar9] = *pwVar8;
    }
    pwVar8 = pwVar8 + 3;
  }
  owner->h_next = x->x_hang;
  x->x_hang = owner;
  owner->h_owner = x;
  x_00 = clock_new(owner,hang_tick);
  owner->h_clock = x_00;
  fVar14 = x->x_deltime;
  if (fVar14 <= 0.0) {
    fVar14 = 0.0;
  }
  clock_delay(x_00,(double)fVar14);
  return;
}

Assistant:

static void pipe_list(t_pipe *x, t_symbol *s, int ac, t_atom *av)
{
    t_hang *h = (t_hang *)
        getbytes(sizeof(*h) + (x->x_n - 1) * sizeof(*h->h_vec));
    t_gpointer *gp, *gp2;
    t_pipeout *p;
    int i, n = x->x_n;
    t_atom *ap;
    t_word *w;
    h->h_gp = (t_gpointer *)getbytes(x->x_nptr * sizeof(t_gpointer));
    if (ac > n)
    {
        if (av[n].a_type == A_FLOAT)
            x->x_deltime = av[n].a_w.w_float;
        else pd_error(x, "pipe: symbol or pointer in time inlet");
        ac = n;
    }
    for (i = 0, gp = x->x_gp, p = x->x_vec, ap = av; i < ac;
        i++, p++, ap++)
    {
        switch (p->p_atom.a_type)
        {
        case A_FLOAT: p->p_atom.a_w.w_float = atom_getfloat(ap); break;
        case A_SYMBOL: p->p_atom.a_w.w_symbol = atom_getsymbol(ap); break;
        case A_POINTER:
            gpointer_unset(gp);
            if (ap->a_type != A_POINTER)
                pd_error(x, "pipe: bad pointer");
            else
            {
                *gp = *(ap->a_w.w_gpointer);
                if (gp->gp_stub) gp->gp_stub->gs_refcount++;
            }
            gp++;
        default: break;
        }
    }
    for (i = 0, gp = x->x_gp, gp2 = h->h_gp, p = x->x_vec, w = h->h_vec;
        i < n; i++, p++, w++)
    {
        if (p->p_atom.a_type == A_POINTER)
        {
            if (gp->gp_stub) gp->gp_stub->gs_refcount++;
            w->w_gpointer = gp2;
            *gp2++ = *gp++;
        }
        else *w = p->p_atom.a_w;
    }
    h->h_next = x->x_hang;
    x->x_hang = h;
    h->h_owner = x;
    h->h_clock = clock_new(h, (t_method)hang_tick);
    clock_delay(h->h_clock, (x->x_deltime >= 0 ? x->x_deltime : 0));
}